

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O2

void __thiscall CompoundFile::Directory::load(Directory *this,Stream *stream)

{
  Directory *pDVar1;
  int iVar2;
  Exception *this_00;
  ushort uVar3;
  ushort uVar4;
  uint16_t symbol;
  Directory *local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> data;
  
  data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve(&data,0x1f);
  uVar4 = 1;
  for (uVar3 = 0x3e; uVar3 != 0xfffe; uVar3 = uVar3 - 2) {
    symbol = 0;
    Excel::Stream::read<unsigned_short>(&stream->super_Stream,&symbol,2);
    if (symbol == 0) break;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&data,&symbol);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::wstring::
  assign<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
            ((wstring *)local_60,
             (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish);
  if (uVar4 < 0x20) {
    (*(stream->super_Stream)._vptr_Stream[4])(stream,(ulong)uVar3,1);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  (*(stream->super_Stream)._vptr_Stream[4])(stream,2,1);
  iVar2 = (*(stream->super_Stream)._vptr_Stream[2])(stream);
  pDVar1 = local_60;
  local_60->m_type = (int)(char)iVar2;
  iVar2 = (*(stream->super_Stream)._vptr_Stream[3])(stream);
  if ((char)iVar2 == '\0') {
    (*(stream->super_Stream)._vptr_Stream[4])(stream,1,1);
    Excel::Stream::read<int>(&stream->super_Stream,&pDVar1->m_leftChild,4);
    Excel::Stream::read<int>(&stream->super_Stream,&pDVar1->m_rightChild,4);
    Excel::Stream::read<int>(&stream->super_Stream,&pDVar1->m_rootNode,4);
    (*(stream->super_Stream)._vptr_Stream[4])(stream,0x24,1);
    data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    Excel::Stream::read<int>(&stream->super_Stream,(int *)&data,4);
    (pDVar1->m_secID).m_id =
         (int32_t)data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
    Excel::Stream::read<int>(&stream->super_Stream,&pDVar1->m_streamSize,4);
    (*(stream->super_Stream)._vptr_Stream[4])(stream,4,1);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstring::wstring((wstring *)&data,L"Unexpected end of file.",(allocator *)&symbol);
  Exception::Exception(this_00,(wstring *)&data);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
Directory::load( Stream & stream )
{
	{
		const int16_t maxSymbolsInName = 32;

		int16_t i = 1;

		std::vector< uint16_t > data;
		data.reserve( maxSymbolsInName - 1 );

		for( ; i <= maxSymbolsInName; ++i )
		{
			uint16_t symbol = 0;
			stream.read( symbol, 2 );

			if( symbol != 0 )
				data.push_back( symbol );
			else
				break;
		}

		m_name.assign( data.begin(), data.end() );

		if( i < maxSymbolsInName )
			stream.seek( ( maxSymbolsInName - i ) * 2, Stream::FromCurrent );
	}

	stream.seek( 2, Stream::FromCurrent );
	m_type = (Type)(int32_t) stream.getByte();

	if( stream.eof() )
		throw Exception( L"Unexpected end of file." );

	stream.seek( 1, Stream::FromCurrent );
	stream.read( m_leftChild, 4 );
	stream.read( m_rightChild, 4 );
	stream.read( m_rootNode, 4 );
	stream.seek( 36, Stream::FromCurrent );

	{
		int32_t sec = 0;
		stream.read( sec, 4 );
		m_secID = sec;
	}

	stream.read( m_streamSize, 4 );
	stream.seek( 4, Stream::FromCurrent );
}